

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O2

void __thiscall
pstd::pmr::polymorphic_allocator<std::byte>::
construct<pbrt::UniformInfiniteLight,pbrt::Transform_const&,pbrt::DenselySampledSpectrum_const*,float&,pstd::pmr::polymorphic_allocator<std::byte>&>
          (polymorphic_allocator<std::byte> *this,UniformInfiniteLight *p,Transform *args,
          DenselySampledSpectrum **args_1,float *args_2,polymorphic_allocator<std::byte> *args_3)

{
  SpectrumHandle local_8;
  
  local_8.
  super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
  .bits = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
           )((ulong)*args_1 | 0x2000000000000);
  pbrt::UniformInfiniteLight::UniformInfiniteLight(p,args,&local_8,*args_2,args_3->memoryResource);
  return;
}

Assistant:

void construct(T *p, Args &&... args) {
        ::new ((void *)p) T(std::forward<Args>(args)...);
    }